

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageOneofFieldLiteGenerator::GenerateFieldInfo
          (ImmutableMessageOneofFieldLiteGenerator *this,Printer *printer,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *output)

{
  int iVar1;
  OneofDescriptor *this_00;
  char *pcVar2;
  int __c;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__s;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *output_local;
  Printer *printer_local;
  ImmutableMessageOneofFieldLiteGenerator *this_local;
  
  iVar1 = FieldDescriptor::number((this->super_ImmutableMessageFieldLiteGenerator).descriptor_);
  WriteIntToUtf16CharSequence(iVar1,output);
  iVar1 = GetExperimentalJavaFieldType((this->super_ImmutableMessageFieldLiteGenerator).descriptor_)
  ;
  __s = output;
  WriteIntToUtf16CharSequence(iVar1,output);
  this_00 = FieldDescriptor::containing_oneof
                      ((this->super_ImmutableMessageFieldLiteGenerator).descriptor_);
  pcVar2 = OneofDescriptor::index(this_00,(char *)__s,__c);
  WriteIntToUtf16CharSequence((int)pcVar2,output);
  io::Printer::Print(printer,&(this->super_ImmutableMessageFieldLiteGenerator).variables_,
                     "$oneof_stored_type$.class,\n");
  return;
}

Assistant:

void ImmutableMessageOneofFieldLiteGenerator::GenerateFieldInfo(
    io::Printer* printer, std::vector<uint16_t>* output) const {
  WriteIntToUtf16CharSequence(descriptor_->number(), output);
  WriteIntToUtf16CharSequence(GetExperimentalJavaFieldType(descriptor_),
                              output);
  WriteIntToUtf16CharSequence(descriptor_->containing_oneof()->index(), output);
  printer->Print(variables_, "$oneof_stored_type$.class,\n");
}